

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_buffer_block_legacy(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  mapped_type *pmVar2;
  CompilerError *this_00;
  Bitset *this_01;
  bool local_42;
  bool block_flag;
  Bitset *block_flags;
  bool ssbo;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,id);
  local_42 = true;
  if (var->storage != StorageBuffer) {
    pmVar2 = ::std::
             unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,&(type_00->super_IVariant).self);
    local_42 = Bitset::get(&(pmVar2->decoration).decoration_flags,3);
  }
  if (local_42 != false) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"SSBOs not supported in legacy targets.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  pmVar2 = ::std::
           unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,&(type_00->super_IVariant).self);
  this_01 = &(pmVar2->decoration).decoration_flags;
  bVar1 = Bitset::get(this_01,2);
  Bitset::clear(this_01,2);
  emit_struct(this,type_00);
  if (bVar1) {
    Bitset::set(this_01,2);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x23])(this,var);
  statement<char_const(&)[1]>(this,(char (*) [1])0xe30c4c);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_legacy(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);
	bool ssbo = var.storage == StorageClassStorageBuffer ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	if (ssbo)
		SPIRV_CROSS_THROW("SSBOs not supported in legacy targets.");

	// We're emitting the push constant block as a regular struct, so disable the block qualifier temporarily.
	// Otherwise, we will end up emitting layout() qualifiers on naked structs which is not allowed.
	auto &block_flags = ir.meta[type.self].decoration.decoration_flags;
	bool block_flag = block_flags.get(DecorationBlock);
	block_flags.clear(DecorationBlock);
	emit_struct(type);
	if (block_flag)
		block_flags.set(DecorationBlock);
	emit_uniform(var);
	statement("");
}